

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::Parser::SetRootType(Parser *this,char *name)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  Namespace *this_00;
  const_iterator cVar3;
  StructDef *pSVar4;
  allocator<char> local_71;
  key_type local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,name,(allocator<char> *)&local_50);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                  *)&this->structs_,&local_70);
  p_Var1 = &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
    pSVar4 = (StructDef *)0x0;
  }
  else {
    pSVar4 = *(StructDef **)(cVar3._M_node + 2);
  }
  if (pSVar4 != (StructDef *)0x0) {
    piVar2 = &(pSVar4->super_Definition).refcount;
    *piVar2 = *piVar2 + 1;
  }
  this->root_struct_def_ = pSVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this->root_struct_def_ == (StructDef *)0x0) {
    this_00 = this->current_namespace_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_71);
    Namespace::GetFullyQualifiedName(&local_70,this_00,&local_50,1000);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)&this->structs_,&local_70);
    if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
      pSVar4 = (StructDef *)0x0;
    }
    else {
      pSVar4 = *(StructDef **)(cVar3._M_node + 2);
    }
    if (pSVar4 != (StructDef *)0x0) {
      piVar2 = &(pSVar4->super_Definition).refcount;
      *piVar2 = *piVar2 + 1;
    }
    this->root_struct_def_ = pSVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return this->root_struct_def_ != (StructDef *)0x0;
}

Assistant:

bool Parser::SetRootType(const char *name) {
  root_struct_def_ = LookupStruct(name);
  if (!root_struct_def_)
    root_struct_def_ =
        LookupStruct(current_namespace_->GetFullyQualifiedName(name));
  return root_struct_def_ != nullptr;
}